

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxUniformComponentsTest::~GeometryShaderMaxUniformComponentsTest
          (GeometryShaderMaxUniformComponentsTest *this)

{
  GeometryShaderMaxUniformComponentsTest *this_local;
  
  ~GeometryShaderMaxUniformComponentsTest(this);
  operator_delete(this,0x368);
  return;
}

Assistant:

virtual ~GeometryShaderMaxUniformComponentsTest()
	{
	}